

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void __thiscall
llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
          (opt<bool,false,llvm::cl::parser<bool>> *this,char (*Ms) [14],desc *Ms_1)

{
  desc *Ms_local_1;
  char (*Ms_local) [14];
  opt<bool,_false,_llvm::cl::parser<bool>_> *this_local;
  
  Option::Option((Option *)this,Optional,NotHidden);
  opt_storage<bool,_false,_false>::opt_storage((opt_storage<bool,_false,_false> *)(this + 0x98));
  *(undefined ***)this = &PTR_handleOccurrence_002572c0;
  parser<bool>::parser((parser<bool> *)(this + 0xb0),(Option *)this);
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[14],llvm::cl::desc>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this,Ms,Ms_1);
  opt<bool,_false,_llvm::cl::parser<bool>_>::done((opt<bool,_false,_llvm::cl::parser<bool>_> *)this)
  ;
  return;
}

Assistant:

explicit opt(const Mods &... Ms)
      : Option(Optional, NotHidden), Parser(*this) {
    apply(this, Ms...);
    done();
  }